

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int nn_symbol_info(int i,nn_symbol_properties *buf,int buflen)

{
  int local_1c;
  int buflen_local;
  nn_symbol_properties *buf_local;
  int i_local;
  
  if ((i < 0) || (0x77 < i)) {
    buf_local._4_4_ = 0;
  }
  else {
    local_1c = buflen;
    if (0x20 < buflen) {
      local_1c = 0x20;
    }
    memcpy(buf,sym_value_names + i,(long)local_1c);
    buf_local._4_4_ = local_1c;
  }
  return buf_local._4_4_;
}

Assistant:

int nn_symbol_info (int i, struct nn_symbol_properties *buf, int buflen)
{
    if (i < 0 || i >= SYM_VALUE_NAMES_LEN) {
        return 0;
    }
    if (buflen > (int)sizeof (struct nn_symbol_properties)) {
        buflen = (int)sizeof (struct nn_symbol_properties);
    }
    memcpy(buf, &sym_value_names [i], buflen);
    return buflen;
}